

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.h
# Opt level: O2

void av1_round_shift_array_32_sse4_1(__m128i *input,__m128i *output,int size,int bit)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  __m128i round;
  undefined1 auVar10 [16];
  
  if (bit < 1) {
    uVar7 = 0;
    uVar8 = (ulong)(uint)size;
    if (size < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      piVar1 = (int *)((long)*input + uVar7);
      iVar9 = piVar1[1];
      iVar3 = piVar1[2];
      iVar4 = piVar1[3];
      piVar2 = (int *)((long)*output + uVar7);
      *piVar2 = *piVar1 << -bit;
      piVar2[1] = iVar9;
      piVar2[2] = iVar3;
      piVar2[3] = iVar4;
    }
  }
  else {
    iVar9 = 1 << ((char)bit - 1U & 0x1f);
    lVar6 = 0;
    uVar8 = (ulong)(uint)size;
    if (size < 1) {
      uVar8 = 0;
    }
    auVar10 = ZEXT416((uint)bit);
    for (; uVar8 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
      piVar1 = (int *)((long)*input + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)*output + lVar6);
      *piVar2 = *piVar1 + iVar9 >> auVar10;
      piVar2[1] = iVar3 + iVar9 >> auVar10;
      piVar2[2] = iVar4 + iVar9 >> auVar10;
      piVar2[3] = iVar5 + iVar9 >> auVar10;
    }
  }
  return;
}

Assistant:

static inline void av1_round_shift_array_32_sse4_1(const __m128i *input,
                                                   __m128i *output,
                                                   const int size,
                                                   const int bit) {
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = av1_round_shift_32_sse4_1(input[i], bit);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = _mm_slli_epi32(input[i], -bit);
    }
  }
}